

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_script.cpp
# Opt level: O2

int CfdInitializeMultisigScriptSig(void *handle,void **multisig_handle)

{
  void *pvVar1;
  CfdException *this;
  allocator local_49;
  undefined1 local_48 [32];
  
  cfd::Initialize();
  if (multisig_handle != (void **)0x0) {
    std::__cxx11::string::string((string *)local_48,"MultiScriptSig",&local_49);
    pvVar1 = cfd::capi::AllocBuffer((string *)local_48,0x15cc);
    *multisig_handle = pvVar1;
    std::__cxx11::string::~string((string *)local_48);
    return 0;
  }
  local_48._0_8_ = "cfdcapi_script.cpp";
  local_48._8_4_ = 0x113;
  local_48._16_8_ = "CfdInitializeMultisigScriptSig";
  cfd::core::logger::warn<>((CfdSourceLocation *)local_48,"multisig sign handle is null.");
  this = (CfdException *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string
            ((string *)local_48,"Failed to parameter. multisig sign handle is null.",&local_49);
  cfd::core::CfdException::CfdException(this,kCfdIllegalArgumentError,(string *)local_48);
  __cxa_throw(this,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdInitializeMultisigScriptSig(void* handle, void** multisig_handle) {
  int result = CfdErrorCode::kCfdUnknownError;
  try {
    cfd::Initialize();
    if (multisig_handle == nullptr) {
      warn(CFD_LOG_SOURCE, "multisig sign handle is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. multisig sign handle is null.");
    }

    *multisig_handle = AllocBuffer(
        kPrefixMultisigScriptSig, sizeof(CfdCapiMultisigScriptSigData));
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    result = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  return result;
}